

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_channel_converter_init_preallocated
                    (ma_channel_converter_config *pConfig,void *pHeap,
                    ma_channel_converter *pConverter)

{
  float fVar1;
  ma_format mVar2;
  ma_channel_mix_mode mVar3;
  ma_channel *pmVar4;
  ma_channel *pmVar5;
  float *pfVar6;
  ma_channel mVar7;
  ma_channel mVar8;
  byte bVar9;
  byte bVar10;
  ma_result mVar11;
  ma_channel_conversion_path mVar12;
  ma_bool32 mVar13;
  ma_uint32 mVar14;
  long lVar15;
  float **ppfVar16;
  ulong uVar17;
  ma_uint8 *pmVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  float fVar22;
  ma_uint32 iChannelOutLFE;
  ma_channel_converter_heap_layout heapLayout;
  uint local_7c;
  ma_channel_converter_config *local_78;
  void *local_70;
  ulong local_68;
  ma_channel *local_60;
  ma_channel_converter_heap_layout local_58;
  
  mVar11 = MA_INVALID_ARGS;
  if (pConverter != (ma_channel_converter *)0x0) {
    pConverter->weights = (anon_union_8_2_43a84514_for_weights)0x0;
    pConverter->_pHeap = (void *)0x0;
    pConverter->pChannelMapOut = (ma_channel *)0x0;
    pConverter->pShuffleTable = (ma_uint8 *)0x0;
    pConverter->conversionPath = ma_channel_conversion_path_unknown;
    *(undefined4 *)&pConverter->field_0x14 = 0;
    pConverter->pChannelMapIn = (ma_channel *)0x0;
    pConverter->format = ma_format_unknown;
    pConverter->channelsIn = 0;
    pConverter->channelsOut = 0;
    pConverter->mixingMode = ma_channel_mix_mode_default;
    *(undefined8 *)&pConverter->_ownsHeap = 0;
    mVar11 = ma_channel_converter_get_heap_layout(pConfig,&local_58);
    if (mVar11 == MA_SUCCESS) {
      pConverter->_pHeap = pHeap;
      if (local_58.sizeInBytes != 0 && pHeap != (void *)0x0) {
        memset(pHeap,0,local_58.sizeInBytes);
      }
      pConverter->format = pConfig->format;
      uVar17._0_4_ = pConfig->channelsIn;
      uVar17._4_4_ = pConfig->channelsOut;
      pConverter->channelsIn = (undefined4)uVar17;
      pConverter->channelsOut = uVar17._4_4_;
      pConverter->mixingMode = pConfig->mixingMode;
      pmVar4 = pConfig->pChannelMapIn;
      if (pmVar4 == (ma_channel *)0x0) {
        pConverter->pChannelMapIn = (ma_channel *)0x0;
      }
      else {
        pConverter->pChannelMapIn = (ma_channel *)(local_58.channelMapInOffset + (long)pHeap);
        ma_channel_map_copy_or_default
                  ((ma_channel *)(local_58.channelMapInOffset + (long)pHeap),uVar17 & 0xffffffff,
                   pmVar4,(undefined4)uVar17);
      }
      pmVar4 = pConfig->pChannelMapOut;
      local_70 = pHeap;
      if (pmVar4 == (ma_channel *)0x0) {
        pConverter->pChannelMapOut = (ma_channel *)0x0;
      }
      else {
        pConverter->pChannelMapOut = (ma_channel *)(local_58.channelMapOutOffset + (long)pHeap);
        ma_channel_map_copy_or_default
                  ((ma_channel *)(local_58.channelMapOutOffset + (long)pHeap),
                   (ulong)pConfig->channelsOut,pmVar4,pConfig->channelsOut);
      }
      local_78 = pConfig;
      mVar12 = ma_channel_map_get_conversion_path
                         (pConfig->pChannelMapIn,pConfig->channelsIn,pConfig->pChannelMapOut,
                          pConfig->channelsOut,pConfig->mixingMode);
      pConverter->conversionPath = mVar12;
      if (mVar12 == ma_channel_conversion_path_shuffle) {
        pmVar18 = (ma_uint8 *)(local_58.shuffleTableOffset + (long)local_70);
        pConverter->pShuffleTable = pmVar18;
        uVar19 = pConverter->channelsIn;
        local_68 = (ulong)pConverter->channelsOut;
        if ((local_70 != (void *)0x0 && (ulong)uVar19 != 0) && local_68 != 0) {
          pmVar4 = pConverter->pChannelMapIn;
          local_60 = pConverter->pChannelMapOut;
          uVar17 = 0;
          do {
            pmVar18[uVar17] = 0xff;
            if (local_60 == (ma_channel *)0x0) {
              bVar10 = ma_channel_map_init_standard_channel
                                 (ma_standard_channel_map_default,(ma_uint32)local_68,
                                  (ma_uint32)uVar17);
            }
            else {
              bVar10 = local_60[uVar17];
            }
            uVar21 = 0;
            do {
              if (pmVar4 == (ma_channel *)0x0) {
                bVar9 = ma_channel_map_init_standard_channel
                                  (ma_standard_channel_map_default,uVar19,(ma_uint32)uVar21);
              }
              else {
                bVar9 = pmVar4[uVar21];
              }
              if (bVar10 == bVar9) {
LAB_0014246c:
                pmVar18[uVar17] = (ma_uint8)uVar21;
              }
              else if (bVar10 < 0xb) {
                if (bVar10 == 2) {
LAB_00142452:
                  if ((bVar9 == 2) || (bVar9 == 0xb)) goto LAB_0014246c;
                }
                else if (bVar10 == 3) goto LAB_00142460;
              }
              else {
                if (bVar10 != 0xc) {
                  if (bVar10 != 0xb) goto LAB_00142470;
                  goto LAB_00142452;
                }
LAB_00142460:
                if ((bVar9 == 0xc) || (bVar9 == 3)) goto LAB_0014246c;
              }
LAB_00142470:
            } while ((bVar10 != bVar9) && (uVar21 = uVar21 + 1, uVar21 < uVar19));
            uVar17 = uVar17 + 1;
          } while (uVar17 != local_68);
        }
      }
      mVar11 = MA_SUCCESS;
      if (pConverter->conversionPath == ma_channel_conversion_path_weights) {
        mVar2 = pConverter->format;
        uVar17 = (ulong)pConverter->channelsIn;
        ppfVar16 = (float **)((long)local_70 + local_58.weightsOffset);
        (pConverter->weights).f32 = ppfVar16;
        if (mVar2 == ma_format_f32) {
          if (uVar17 != 0) {
            uVar19 = pConverter->channelsOut;
            ppfVar16 = ppfVar16 + uVar17;
            uVar21 = 0;
            do {
              (pConverter->weights).f32[uVar21] = (float *)ppfVar16;
              uVar21 = uVar21 + 1;
              ppfVar16 = (float **)((long)ppfVar16 + (ulong)uVar19 * 4);
            } while (uVar17 != uVar21);
          }
        }
        else if (uVar17 != 0) {
          uVar19 = pConverter->channelsOut;
          ppfVar16 = ppfVar16 + uVar17;
          uVar21 = 0;
          do {
            (pConverter->weights).f32[uVar21] = (float *)ppfVar16;
            uVar21 = uVar21 + 1;
            ppfVar16 = (float **)((long)ppfVar16 + (ulong)uVar19 * 4);
          } while (uVar17 != uVar21);
        }
        if (pConverter->channelsIn != 0) {
          uVar17 = 0;
          do {
            if (pConverter->channelsOut != 0) {
              uVar21 = 0;
              do {
                (pConverter->weights).f32[uVar17][uVar21] = 0.0;
                uVar21 = uVar21 + 1;
              } while (uVar21 < pConverter->channelsOut);
            }
            uVar17 = uVar17 + 1;
          } while (uVar17 < pConverter->channelsIn);
        }
        uVar17 = (ulong)pConverter->channelsIn;
        if (pConverter->channelsIn != 0) {
          pmVar4 = pConverter->pChannelMapIn;
          uVar21 = 0;
          do {
            if (pmVar4 == (ma_channel *)0x0) {
              mVar7 = ma_channel_map_init_standard_channel
                                (ma_standard_channel_map_default,(ma_uint32)uVar17,(ma_uint32)uVar21
                                );
            }
            else {
              mVar7 = pmVar4[uVar21];
            }
            uVar17 = (ulong)pConverter->channelsOut;
            if (pConverter->channelsOut != 0) {
              pmVar5 = pConverter->pChannelMapOut;
              uVar20 = 0;
              do {
                if (pmVar5 == (ma_channel *)0x0) {
                  mVar8 = ma_channel_map_init_standard_channel
                                    (ma_standard_channel_map_default,(ma_uint32)uVar17,
                                     (ma_uint32)uVar20);
                }
                else {
                  mVar8 = pmVar5[uVar20];
                }
                if (mVar7 == mVar8) {
                  if (mVar2 == ma_format_f32) {
                    (pConverter->weights).f32[uVar21][uVar20] = 1.0;
                  }
                  else {
                    (pConverter->weights).f32[uVar21][uVar20] = 5.73972e-42;
                  }
                }
                uVar20 = uVar20 + 1;
                uVar17 = (ulong)pConverter->channelsOut;
              } while (uVar20 < uVar17);
            }
            uVar21 = uVar21 + 1;
            uVar17 = (ulong)pConverter->channelsIn;
          } while (uVar21 < uVar17);
        }
        mVar3 = pConverter->mixingMode;
        if (mVar3 != ma_channel_mix_mode_simple) {
          if (mVar3 == ma_channel_mix_mode_custom_weights) {
            ppfVar16 = local_78->ppWeights;
            if (ppfVar16 == (float **)0x0) {
              return MA_INVALID_ARGS;
            }
            if (pConverter->channelsIn == 0) {
              return MA_SUCCESS;
            }
            uVar17 = 0;
            do {
              if (pConverter->channelsOut != 0) {
                pfVar6 = ppfVar16[uVar17];
                uVar21 = 0;
                do {
                  fVar22 = pfVar6[uVar21];
                  if (mVar2 == ma_format_f32) {
                    (pConverter->weights).f32[uVar17][uVar21] = fVar22;
                  }
                  else {
                    (pConverter->weights).f32[uVar17][uVar21] = (float)(int)(fVar22 * 4096.0);
                  }
                  uVar21 = uVar21 + 1;
                } while (uVar21 < pConverter->channelsOut);
              }
              uVar17 = uVar17 + 1;
            } while (uVar17 < pConverter->channelsIn);
            return MA_SUCCESS;
          }
          uVar17 = (ulong)pConverter->channelsIn;
          if (pConverter->channelsIn != 0) {
            pmVar4 = pConverter->pChannelMapIn;
            uVar21 = 0;
            do {
              if (pmVar4 == (ma_channel *)0x0) {
                bVar10 = ma_channel_map_init_standard_channel
                                   (ma_standard_channel_map_default,(ma_uint32)uVar17,
                                    (ma_uint32)uVar21);
              }
              else {
                bVar10 = pmVar4[uVar21];
              }
              if (((5 < bVar10) || ((0x23U >> (bVar10 & 0x1f) & 1) == 0)) &&
                 (0x1f < (byte)(bVar10 - 0x14))) {
                lVar15 = 0;
                do {
                  fVar22 = *(float *)((long)g_maChannelPlaneRatios[0] +
                                     (ulong)((uint)bVar10 * 8) * 3 + lVar15 * 4);
                  if ((fVar22 != 0.0) || (NAN(fVar22))) {
                    pmVar5 = pConverter->pChannelMapOut;
                    mVar13 = ma_channel_map_contains_channel_position
                                       (pConverter->channelsOut,pmVar5,bVar10);
                    if ((mVar13 == 0) &&
                       (uVar17 = (ulong)pConverter->channelsOut, pConverter->channelsOut != 0)) {
                      uVar20 = 0;
                      do {
                        if (pmVar5 == (ma_channel *)0x0) {
                          bVar9 = ma_channel_map_init_standard_channel
                                            (ma_standard_channel_map_default,(ma_uint32)uVar17,
                                             (ma_uint32)uVar20);
                        }
                        else {
                          bVar9 = pmVar5[uVar20];
                        }
                        if (((5 < bVar9) || ((0x23U >> (bVar9 & 0x1f) & 1) == 0)) &&
                           (0x1f < (byte)(bVar9 - 0x14))) {
                          lVar15 = 0;
                          do {
                            fVar22 = *(float *)((long)g_maChannelPlaneRatios[0] +
                                               (ulong)((uint)bVar9 * 8) * 3 + lVar15 * 4);
                            if ((fVar22 != 0.0) || (NAN(fVar22))) {
                              fVar22 = 0.0;
                              if (mVar3 == ma_channel_mix_mode_default) {
                                fVar22 = g_maChannelPlaneRatios[bVar10][5] *
                                         g_maChannelPlaneRatios[bVar9][5] +
                                         g_maChannelPlaneRatios[bVar10][4] *
                                         g_maChannelPlaneRatios[bVar9][4] +
                                         g_maChannelPlaneRatios[bVar10][3] *
                                         g_maChannelPlaneRatios[bVar9][3] +
                                         g_maChannelPlaneRatios[bVar10][2] *
                                         g_maChannelPlaneRatios[bVar9][2] +
                                         g_maChannelPlaneRatios[bVar10][0] *
                                         g_maChannelPlaneRatios[bVar9][0] +
                                         g_maChannelPlaneRatios[bVar10][1] *
                                         g_maChannelPlaneRatios[bVar9][1];
                              }
                              if (mVar2 == ma_format_f32) {
                                fVar1 = (pConverter->weights).f32[uVar21][uVar20];
                                if ((fVar1 == 0.0) && (!NAN(fVar1))) {
                                  (pConverter->weights).f32[uVar21][uVar20] = fVar22;
                                }
                              }
                              else if ((pConverter->weights).f32[uVar21][uVar20] == 0.0) {
                                (pConverter->weights).f32[uVar21][uVar20] =
                                     (float)(int)(fVar22 * 4096.0);
                              }
                              break;
                            }
                            lVar15 = lVar15 + 1;
                          } while (lVar15 != 6);
                        }
                        uVar20 = uVar20 + 1;
                        uVar17 = (ulong)pConverter->channelsOut;
                      } while (uVar20 < uVar17);
                    }
                    break;
                  }
                  lVar15 = lVar15 + 1;
                } while (lVar15 != 6);
              }
              uVar21 = uVar21 + 1;
              uVar17 = (ulong)pConverter->channelsIn;
            } while (uVar21 < uVar17);
          }
          uVar19 = pConverter->channelsOut;
          uVar17 = (ulong)uVar19;
          if (uVar19 != 0) {
            pmVar4 = pConverter->pChannelMapOut;
            uVar21 = 0;
            do {
              if (pmVar4 == (ma_channel *)0x0) {
                bVar10 = ma_channel_map_init_standard_channel
                                   (ma_standard_channel_map_default,(ma_uint32)uVar17,
                                    (ma_uint32)uVar21);
              }
              else {
                bVar10 = pmVar4[uVar21];
              }
              if (((5 < bVar10) || ((0x23U >> (bVar10 & 0x1f) & 1) == 0)) &&
                 (0x1f < (byte)(bVar10 - 0x14))) {
                lVar15 = 0;
                do {
                  fVar22 = *(float *)((long)g_maChannelPlaneRatios[0] +
                                     (ulong)((uint)bVar10 * 8) * 3 + lVar15 * 4);
                  if ((fVar22 != 0.0) || (NAN(fVar22))) {
                    pmVar5 = pConverter->pChannelMapIn;
                    mVar13 = ma_channel_map_contains_channel_position
                                       (pConverter->channelsIn,pmVar5,bVar10);
                    if ((mVar13 == 0) &&
                       (uVar17 = (ulong)pConverter->channelsIn, pConverter->channelsIn != 0)) {
                      uVar20 = 0;
                      do {
                        if (pmVar5 == (ma_channel *)0x0) {
                          bVar9 = ma_channel_map_init_standard_channel
                                            (ma_standard_channel_map_default,(ma_uint32)uVar17,
                                             (ma_uint32)uVar20);
                        }
                        else {
                          bVar9 = pmVar5[uVar20];
                        }
                        if (((5 < bVar9) || ((0x23U >> (bVar9 & 0x1f) & 1) == 0)) &&
                           (0x1f < (byte)(bVar9 - 0x14))) {
                          lVar15 = 0;
                          do {
                            fVar22 = *(float *)((long)g_maChannelPlaneRatios[0] +
                                               (ulong)((uint)bVar9 * 8) * 3 + lVar15 * 4);
                            if ((fVar22 != 0.0) || (NAN(fVar22))) {
                              fVar22 = 0.0;
                              if (mVar3 == ma_channel_mix_mode_default) {
                                fVar22 = g_maChannelPlaneRatios[bVar9][5] *
                                         g_maChannelPlaneRatios[bVar10][5] +
                                         g_maChannelPlaneRatios[bVar9][4] *
                                         g_maChannelPlaneRatios[bVar10][4] +
                                         g_maChannelPlaneRatios[bVar9][3] *
                                         g_maChannelPlaneRatios[bVar10][3] +
                                         g_maChannelPlaneRatios[bVar9][2] *
                                         g_maChannelPlaneRatios[bVar10][2] +
                                         g_maChannelPlaneRatios[bVar9][0] *
                                         g_maChannelPlaneRatios[bVar10][0] +
                                         g_maChannelPlaneRatios[bVar9][1] *
                                         g_maChannelPlaneRatios[bVar10][1];
                              }
                              if (mVar2 == ma_format_f32) {
                                fVar1 = (pConverter->weights).f32[uVar20][uVar21];
                                if ((fVar1 == 0.0) && (!NAN(fVar1))) {
                                  (pConverter->weights).f32[uVar20][uVar21] = fVar22;
                                }
                              }
                              else if ((pConverter->weights).f32[uVar20][uVar21] == 0.0) {
                                (pConverter->weights).f32[uVar20][uVar21] =
                                     (float)(int)(fVar22 * 4096.0);
                              }
                              break;
                            }
                            lVar15 = lVar15 + 1;
                          } while (lVar15 != 6);
                        }
                        uVar20 = uVar20 + 1;
                        uVar17 = (ulong)pConverter->channelsIn;
                      } while (uVar20 < uVar17);
                    }
                    break;
                  }
                  lVar15 = lVar15 + 1;
                } while (lVar15 != 6);
              }
              uVar21 = uVar21 + 1;
              uVar19 = pConverter->channelsOut;
              uVar17 = (ulong)uVar19;
            } while (uVar21 < uVar17);
          }
          if (local_78->calculateLFEFromSpatialChannels != 0) {
            mVar14 = pConverter->channelsIn;
            pmVar4 = pConverter->pChannelMapIn;
            mVar13 = ma_channel_map_contains_channel_position(mVar14,pmVar4,'\x05');
            if ((((mVar13 == 0) &&
                 (mVar14 = ma_channel_map_get_spatial_channel_count(pmVar4,mVar14), mVar14 != 0)) &&
                (mVar13 = ma_channel_map_find_channel_position
                                    (uVar19,pConverter->pChannelMapOut,'\x05',&local_7c),
                mVar13 != 0)) &&
               (uVar17 = (ulong)pConverter->channelsIn, pConverter->channelsIn != 0)) {
              uVar21 = 0;
              do {
                if (pmVar4 == (ma_channel *)0x0) {
                  bVar10 = ma_channel_map_init_standard_channel
                                     (ma_standard_channel_map_default,(ma_uint32)uVar17,
                                      (ma_uint32)uVar21);
                }
                else {
                  bVar10 = pmVar4[uVar21];
                }
                if (((5 < bVar10) || ((0x23U >> (bVar10 & 0x1f) & 1) == 0)) &&
                   (0x1f < (byte)(bVar10 - 0x14))) {
                  lVar15 = 0;
                  do {
                    if ((g_maChannelPlaneRatios[bVar10][lVar15] != 0.0) ||
                       (NAN(g_maChannelPlaneRatios[bVar10][lVar15]))) {
                      uVar17 = (ulong)local_7c;
                      if (mVar2 == ma_format_f32) {
                        fVar22 = (pConverter->weights).f32[uVar21][uVar17];
                        if ((fVar22 == 0.0) && (!NAN(fVar22))) {
                          (pConverter->weights).f32[uVar21][uVar17] = 1.0 / (float)mVar14;
                        }
                      }
                      else if ((pConverter->weights).f32[uVar21][uVar17] == 0.0) {
                        (pConverter->weights).f32[uVar21][uVar17] =
                             (float)(int)((1.0 / (float)mVar14) * 4096.0);
                      }
                      break;
                    }
                    lVar15 = lVar15 + 1;
                  } while (lVar15 != 6);
                }
                uVar21 = uVar21 + 1;
                uVar17 = (ulong)pConverter->channelsIn;
              } while (uVar21 < uVar17);
            }
          }
        }
        mVar11 = MA_SUCCESS;
      }
    }
  }
  return mVar11;
}

Assistant:

MA_API ma_result ma_channel_converter_init_preallocated(const ma_channel_converter_config* pConfig, void* pHeap, ma_channel_converter* pConverter)
{
    ma_result result;
    ma_channel_converter_heap_layout heapLayout;

    if (pConverter == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pConverter);

    result = ma_channel_converter_get_heap_layout(pConfig, &heapLayout);
    if (result != MA_SUCCESS) {
        return result;
    }

    pConverter->_pHeap = pHeap;
    MA_ZERO_MEMORY(pConverter->_pHeap, heapLayout.sizeInBytes);

    pConverter->format      = pConfig->format;
    pConverter->channelsIn  = pConfig->channelsIn;
    pConverter->channelsOut = pConfig->channelsOut;
    pConverter->mixingMode  = pConfig->mixingMode;

    if (pConfig->pChannelMapIn != NULL) {
        pConverter->pChannelMapIn = (ma_channel*)ma_offset_ptr(pHeap, heapLayout.channelMapInOffset);
        ma_channel_map_copy_or_default(pConverter->pChannelMapIn, pConfig->channelsIn, pConfig->pChannelMapIn, pConfig->channelsIn);
    } else {
        pConverter->pChannelMapIn = NULL;   /* Use default channel map. */
    }

    if (pConfig->pChannelMapOut != NULL) {
        pConverter->pChannelMapOut = (ma_channel*)ma_offset_ptr(pHeap, heapLayout.channelMapOutOffset);
        ma_channel_map_copy_or_default(pConverter->pChannelMapOut, pConfig->channelsOut, pConfig->pChannelMapOut, pConfig->channelsOut);
    } else {
        pConverter->pChannelMapOut = NULL;  /* Use default channel map. */
    }

    pConverter->conversionPath = ma_channel_converter_config_get_conversion_path(pConfig);

    if (pConverter->conversionPath == ma_channel_conversion_path_shuffle) {
        pConverter->pShuffleTable = (ma_uint8*)ma_offset_ptr(pHeap, heapLayout.shuffleTableOffset);
        ma_channel_map_build_shuffle_table(pConverter->pChannelMapIn, pConverter->channelsIn, pConverter->pChannelMapOut, pConverter->channelsOut, pConverter->pShuffleTable);
    }

    if (pConverter->conversionPath == ma_channel_conversion_path_weights) {
        ma_uint32 iChannelIn;
        ma_uint32 iChannelOut;

        if (pConverter->format == ma_format_f32) {
            pConverter->weights.f32 = (float**   )ma_offset_ptr(pHeap, heapLayout.weightsOffset);
            for (iChannelIn = 0; iChannelIn < pConverter->channelsIn; iChannelIn += 1) {
                pConverter->weights.f32[iChannelIn] = (float*)ma_offset_ptr(pHeap, heapLayout.weightsOffset + ((sizeof(float*) * pConverter->channelsIn) + (sizeof(float) * pConverter->channelsOut * iChannelIn)));
            }
        } else {
            pConverter->weights.s16 = (ma_int32**)ma_offset_ptr(pHeap, heapLayout.weightsOffset);
            for (iChannelIn = 0; iChannelIn < pConverter->channelsIn; iChannelIn += 1) {
                pConverter->weights.s16[iChannelIn] = (ma_int32*)ma_offset_ptr(pHeap, heapLayout.weightsOffset + ((sizeof(ma_int32*) * pConverter->channelsIn) + (sizeof(ma_int32) * pConverter->channelsOut * iChannelIn)));
            }
        }

        /* Silence our weights by default. */
        for (iChannelIn = 0; iChannelIn < pConverter->channelsIn; iChannelIn += 1) {
            for (iChannelOut = 0; iChannelOut < pConverter->channelsOut; iChannelOut += 1) {
                if (pConverter->format == ma_format_f32) {
                    pConverter->weights.f32[iChannelIn][iChannelOut] = 0.0f;
                } else {
                    pConverter->weights.s16[iChannelIn][iChannelOut] = 0;
                }
            }
        }

        /*
        We now need to fill out our weights table. This is determined by the mixing mode.
        */

        /* In all cases we need to make sure all channels that are present in both channel maps have a 1:1 mapping. */
        for (iChannelIn = 0; iChannelIn < pConverter->channelsIn; ++iChannelIn) {
            ma_channel channelPosIn = ma_channel_map_get_channel(pConverter->pChannelMapIn, pConverter->channelsIn, iChannelIn);

            for (iChannelOut = 0; iChannelOut < pConverter->channelsOut; ++iChannelOut) {
                ma_channel channelPosOut = ma_channel_map_get_channel(pConverter->pChannelMapOut, pConverter->channelsOut, iChannelOut);

                if (channelPosIn == channelPosOut) {
                    float weight = 1;

                    if (pConverter->format == ma_format_f32) {
                        pConverter->weights.f32[iChannelIn][iChannelOut] = weight;
                    } else {
                        pConverter->weights.s16[iChannelIn][iChannelOut] = ma_channel_converter_float_to_fixed(weight);
                    }
                }
            }
        }

        switch (pConverter->mixingMode)
        {
            case ma_channel_mix_mode_custom_weights:
            {
                if (pConfig->ppWeights == NULL) {
                    return MA_INVALID_ARGS; /* Config specified a custom weights mixing mode, but no custom weights have been specified. */
                }

                for (iChannelIn = 0; iChannelIn < pConverter->channelsIn; iChannelIn += 1) {
                    for (iChannelOut = 0; iChannelOut < pConverter->channelsOut; iChannelOut += 1) {
                        float weight = pConfig->ppWeights[iChannelIn][iChannelOut];

                        if (pConverter->format == ma_format_f32) {
                            pConverter->weights.f32[iChannelIn][iChannelOut] = weight;
                        } else {
                            pConverter->weights.s16[iChannelIn][iChannelOut] = ma_channel_converter_float_to_fixed(weight);
                        }
                    }
                }
            } break;

            case ma_channel_mix_mode_simple:
            {
                /*
                In simple mode, only set weights for channels that have exactly matching types, leave the rest at
                zero. The 1:1 mappings have already been covered before this switch statement.
                */
            } break;

            case ma_channel_mix_mode_rectangular:
            default:
            {
                /* Unmapped input channels. */
                for (iChannelIn = 0; iChannelIn < pConverter->channelsIn; ++iChannelIn) {
                    ma_channel channelPosIn = ma_channel_map_get_channel(pConverter->pChannelMapIn, pConverter->channelsIn, iChannelIn);

                    if (ma_is_spatial_channel_position(channelPosIn)) {
                        if (!ma_channel_map_contains_channel_position(pConverter->channelsOut, pConverter->pChannelMapOut, channelPosIn)) {
                            for (iChannelOut = 0; iChannelOut < pConverter->channelsOut; ++iChannelOut) {
                                ma_channel channelPosOut = ma_channel_map_get_channel(pConverter->pChannelMapOut, pConverter->channelsOut, iChannelOut);

                                if (ma_is_spatial_channel_position(channelPosOut)) {
                                    float weight = 0;
                                    if (pConverter->mixingMode == ma_channel_mix_mode_rectangular) {
                                        weight = ma_calculate_channel_position_rectangular_weight(channelPosIn, channelPosOut);
                                    }

                                    /* Only apply the weight if we haven't already got some contribution from the respective channels. */
                                    if (pConverter->format == ma_format_f32) {
                                        if (pConverter->weights.f32[iChannelIn][iChannelOut] == 0) {
                                            pConverter->weights.f32[iChannelIn][iChannelOut] = weight;
                                        }
                                    } else {
                                        if (pConverter->weights.s16[iChannelIn][iChannelOut] == 0) {
                                            pConverter->weights.s16[iChannelIn][iChannelOut] = ma_channel_converter_float_to_fixed(weight);
                                        }
                                    }
                                }
                            }
                        }
                    }
                }

                /* Unmapped output channels. */
                for (iChannelOut = 0; iChannelOut < pConverter->channelsOut; ++iChannelOut) {
                    ma_channel channelPosOut = ma_channel_map_get_channel(pConverter->pChannelMapOut, pConverter->channelsOut, iChannelOut);

                    if (ma_is_spatial_channel_position(channelPosOut)) {
                        if (!ma_channel_map_contains_channel_position(pConverter->channelsIn, pConverter->pChannelMapIn, channelPosOut)) {
                            for (iChannelIn = 0; iChannelIn < pConverter->channelsIn; ++iChannelIn) {
                                ma_channel channelPosIn = ma_channel_map_get_channel(pConverter->pChannelMapIn, pConverter->channelsIn, iChannelIn);

                                if (ma_is_spatial_channel_position(channelPosIn)) {
                                    float weight = 0;
                                    if (pConverter->mixingMode == ma_channel_mix_mode_rectangular) {
                                        weight = ma_calculate_channel_position_rectangular_weight(channelPosIn, channelPosOut);
                                    }

                                    /* Only apply the weight if we haven't already got some contribution from the respective channels. */
                                    if (pConverter->format == ma_format_f32) {
                                        if (pConverter->weights.f32[iChannelIn][iChannelOut] == 0) {
                                            pConverter->weights.f32[iChannelIn][iChannelOut] = weight;
                                        }
                                    } else {
                                        if (pConverter->weights.s16[iChannelIn][iChannelOut] == 0) {
                                            pConverter->weights.s16[iChannelIn][iChannelOut] = ma_channel_converter_float_to_fixed(weight);
                                        }
                                    }
                                }
                            }
                        }
                    }
                }

                /* If LFE is in the output channel map but was not present in the input channel map, configure its weight now */
                if (pConfig->calculateLFEFromSpatialChannels) {
                    if (!ma_channel_map_contains_channel_position(pConverter->channelsIn, pConverter->pChannelMapIn, MA_CHANNEL_LFE)) {
                        ma_uint32 spatialChannelCount = ma_channel_map_get_spatial_channel_count(pConverter->pChannelMapIn, pConverter->channelsIn);
                        ma_uint32 iChannelOutLFE;

                        if (spatialChannelCount > 0 && ma_channel_map_find_channel_position(pConverter->channelsOut, pConverter->pChannelMapOut, MA_CHANNEL_LFE, &iChannelOutLFE)) {
                            const float weightForLFE = 1.0f / spatialChannelCount;
                            for (iChannelIn = 0; iChannelIn < pConverter->channelsIn; ++iChannelIn) {
                                const ma_channel channelPosIn = ma_channel_map_get_channel(pConverter->pChannelMapIn, pConverter->channelsIn, iChannelIn);
                                if (ma_is_spatial_channel_position(channelPosIn)) {
                                    if (pConverter->format == ma_format_f32) {
                                        if (pConverter->weights.f32[iChannelIn][iChannelOutLFE] == 0) {
                                            pConverter->weights.f32[iChannelIn][iChannelOutLFE] = weightForLFE;
                                        }
                                    } else {
                                        if (pConverter->weights.s16[iChannelIn][iChannelOutLFE] == 0) {
                                            pConverter->weights.s16[iChannelIn][iChannelOutLFE] = ma_channel_converter_float_to_fixed(weightForLFE);
                                        }
                                    }
                                }
                            }
                        }
                    }
                }
            } break;
        }
    }

    return MA_SUCCESS;
}